

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O2

nes_system * nes_system_create(nes_config *config)

{
  nes_source_type nVar1;
  undefined4 uVar2;
  FILE *__stream;
  size_t __size;
  void *__ptr;
  nes_cartridge *pnVar3;
  nes_system *system;
  long lVar4;
  nes_config *pnVar5;
  byte bVar6;
  
  bVar6 = 0;
  nVar1 = config->source_type;
  if (nVar1 == NES_SOURCE_CARTRIGE) {
    pnVar3 = (config->source).cartridge;
  }
  else if (nVar1 == NES_SOURCE_MEMORY) {
    pnVar3 = nes_rom_create_cartridge
                       ((config->source).memory.data,(config->source).memory.data_size);
  }
  else {
    if (nVar1 != NES_SOURCE_FILE) {
      return (nes_system *)0x0;
    }
    __stream = fopen((config->source).file_path,"rb");
    if (__stream == (FILE *)0x0) {
      perror("Failed to load NES ROM");
      return (nes_system *)0x0;
    }
    fseek(__stream,0,2);
    __size = ftell(__stream);
    fseek(__stream,0,0);
    __ptr = malloc(__size);
    fread(__ptr,__size,1,__stream);
    pnVar3 = nes_rom_create_cartridge(__ptr,__size);
    free(__ptr);
    fclose(__stream);
  }
  if (pnVar3 == (nes_cartridge *)0x0) {
    return (nes_system *)0x0;
  }
  system = (nes_system *)malloc(0x1c710);
  system->cartridge = pnVar3;
  pnVar5 = &system->config;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar2 = *(undefined4 *)&config->field_0x4;
    pnVar5->source_type = config->source_type;
    *(undefined4 *)&pnVar5->field_0x4 = uVar2;
    config = (nes_config *)((long)config + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (nes_config *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  nes_system_reset(system);
  return system;
}

Assistant:

nes_system* nes_system_create(nes_config* config)
{
    nes_cartridge* cartridge = 0;

    if (config->source_type == NES_SOURCE_FILE)
    {
        cartridge = nes_rom_load_cartridge(config->source.file_path);
    }
    else if (config->source_type == NES_SOURCE_MEMORY)
    {
        cartridge = nes_rom_create_cartridge(config->source.memory.data, config->source.memory.data_size);
    }
    else if (config->source_type == NES_SOURCE_CARTRIGE)
    {
        cartridge = config->source.cartridge;
    }

    if (!cartridge)
        return 0;

    nes_system* system  = (nes_system*)malloc(sizeof(nes_system));
    system->cartridge   = cartridge;
    system->config      = *config;

    nes_system_reset(system);

    return system;
}